

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Minefield_Query_PDU::Minefield_Query_PDU(Minefield_Query_PDU *this,KDataStream *stream)

{
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_Query_PDU_002220a0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReqID);
  DATA_TYPE::MinefieldDataFilter::MinefieldDataFilter(&this->m_DataFilter);
  DATA_TYPE::EntityType::EntityType(&this->m_MineTypFilter);
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vui16SensorTypes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (*(this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,0);
  return;
}

Assistant:

Minefield_Query_PDU::Minefield_Query_PDU(KDataStream &stream) noexcept(false)
{
    Decode( stream, false );
}